

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

RegisterSpace * Js::AllocateRegisterSpace(ArenaAllocator *alloc,Types type)

{
  code *pcVar1;
  bool bVar2;
  RegisterSpace *pRVar3;
  undefined4 *puVar4;
  
  switch(type) {
  case INT32:
    pRVar3 = (RegisterSpace *)new<Memory::ArenaAllocator>(0x50,alloc,0x366bee);
    pRVar3->mRegisterCount = 1;
    pRVar3->mFirstTmpReg = 1;
    pRVar3->mNextLocation = 1;
    pRVar3->mNbConst = 1;
    JsUtil::
    BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&pRVar3[1].mFirstTmpReg,alloc,0);
    break;
  case INT64:
    pRVar3 = (RegisterSpace *)new<Memory::ArenaAllocator>(0x50,alloc,0x366bee);
    pRVar3->mRegisterCount = 1;
    pRVar3->mFirstTmpReg = 1;
    pRVar3->mNextLocation = 1;
    pRVar3->mNbConst = 1;
    JsUtil::
    BaseDictionary<long,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<long,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&pRVar3[1].mFirstTmpReg,alloc,0);
    break;
  case FLOAT32:
    pRVar3 = (RegisterSpace *)new<Memory::ArenaAllocator>(0x50,alloc,0x366bee);
    pRVar3->mRegisterCount = 1;
    pRVar3->mFirstTmpReg = 1;
    pRVar3->mNextLocation = 1;
    pRVar3->mNbConst = 1;
    JsUtil::
    BaseDictionary<float,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<float,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&pRVar3[1].mFirstTmpReg,alloc,0);
    break;
  case FLOAT64:
    pRVar3 = (RegisterSpace *)new<Memory::ArenaAllocator>(0x50,alloc,0x366bee);
    pRVar3->mRegisterCount = 1;
    pRVar3->mFirstTmpReg = 1;
    pRVar3->mNextLocation = 1;
    pRVar3->mNbConst = 1;
    JsUtil::
    BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&pRVar3[1].mFirstTmpReg,alloc,0);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x2c4,"(false)","Invalid native asm.js type");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    Throw::InternalError();
  }
  return pRVar3;
}

Assistant:

WAsmJs::RegisterSpace*
        AllocateRegisterSpace(ArenaAllocator* alloc, WAsmJs::Types type)
    {
        switch(type)
        {
        case WAsmJs::INT32: return Anew(alloc, AsmJsRegisterSpace<int>, alloc);
        case WAsmJs::FLOAT32: return Anew(alloc, AsmJsRegisterSpace<float>, alloc);
        case WAsmJs::FLOAT64: return Anew(alloc, AsmJsRegisterSpace<double>, alloc);
#if TARGET_64
        case WAsmJs::INT64: return Anew(alloc, AsmJsRegisterSpace<int64>, alloc);
#endif
        default:
            AssertMsg(false, "Invalid native asm.js type");
            Js::Throw::InternalError();
        }
    }